

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O2

void mk_iov_print(mk_iov *mk_io)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar3 = 0; (long)uVar3 < (long)mk_io->iov_idx; uVar3 = uVar3 + 1) {
    uVar1 = 0;
    printf("\n[index=%i len=%i]\n\'",uVar3 & 0xffffffff,(ulong)(uint)mk_io->io[uVar3].iov_len);
    fflush(_stdout);
    while( true ) {
      uVar2 = (ulong)uVar1;
      if (mk_io->io[uVar3].iov_len <= uVar2) break;
      putchar((int)*(char *)((long)mk_io->io[uVar3].iov_base + uVar2));
      fflush(_stdout);
      uVar1 = uVar1 + 1;
    }
    printf("\'[end=%i]\n",uVar2);
    fflush(_stdout);
  }
  return;
}

Assistant:

void mk_iov_print(struct mk_iov *mk_io)
{
    int i;
    unsigned j;
    char *c;

    for (i = 0; i < mk_io->iov_idx; i++) {
        printf("\n[index=%i len=%i]\n'", i, (int) mk_io->io[i].iov_len);
        fflush(stdout);

        for (j=0; j < mk_io->io[i].iov_len; j++) {
            c = mk_io->io[i].iov_base;
            printf("%c", c[j]);
            fflush(stdout);
        }
        printf("'[end=%i]\n", j);
        fflush(stdout);
    }
}